

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O1

void __thiscall xercesc_4_0::DGXMLScanner::scanDocTypeDecl(DGXMLScanner *this)

{
  ReaderMgr *this_00;
  XMLBufferMgr *this_01;
  short *psVar1;
  DocTypeHandler *pDVar2;
  MemoryManager *pMVar3;
  NameIdPool<xercesc_4_0::DTDElementDecl> *pNVar4;
  Grammar *pGVar5;
  void *pvVar6;
  GrammarResolver *this_02;
  XMLValidator *pXVar7;
  XMLStringPool *pXVar8;
  InputSource *pIVar9;
  bool bVar10;
  bool bVar11;
  XMLCh XVar12;
  XMLCh XVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  XMLBuffer *toFill;
  undefined4 extraout_var;
  DTDElementDecl *this_03;
  ulong uVar18;
  DTDElementDecl *pDVar19;
  char16_t *pcVar20;
  XMLCh *pXVar21;
  XMLSize_t XVar22;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  DTDGrammar *pDVar23;
  XMLReader *pXVar24;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  XMLEntityDecl *this_04;
  undefined4 extraout_var_06;
  RuntimeException *this_05;
  undefined4 extraout_var_07;
  MemoryManager **ppMVar25;
  size_t sVar26;
  InputSource *pIVar27;
  RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *pRVar28;
  InputSource *srcUsed;
  bool skippedSomething;
  char16_t *local_f0;
  ArrayJanitor<char16_t> janSysId;
  ArrayJanitor<char16_t> janPubId;
  XMLBufBid bbRootName;
  XMLCh gDTDStr [4];
  int colonPosition;
  DTDScanner dtdScanner;
  XMLCh *pXVar17;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  pDVar2 = (this->super_XMLScanner).fDocTypeHandler;
  if (pDVar2 != (DocTypeHandler *)0x0) {
    (*pDVar2->_vptr_DocTypeHandler[0xc])();
  }
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  ReaderMgr::skipPastSpaces(this_00,&skippedSomething,false);
  if (skippedSomething == false) {
    XMLScanner::emitError(&this->super_XMLScanner,ExpectedWhitespace);
    do {
      XVar12 = ReaderMgr::getNextChar(this_00);
      if (XVar12 == L'\0') {
        return;
      }
    } while (XVar12 != L'>');
    return;
  }
  this_01 = &(this->super_XMLScanner).fBufMgr;
  toFill = XMLBufferMgr::bidOnBuffer(this_01);
  bVar10 = (this->super_XMLScanner).fDoNamespaces;
  toFill->fIndex = 0;
  pXVar24 = (this->super_XMLScanner).fReaderMgr.fCurReader;
  if (bVar10 == true) {
    bVar10 = XMLReader::getQName(pXVar24,toFill,&colonPosition);
  }
  else {
    bVar10 = XMLReader::getName(pXVar24,toFill,false);
  }
  if (bVar10 == false) {
    if (toFill->fIndex == 0) {
      XMLScanner::emitError(&this->super_XMLScanner,NoRootElemInDOCTYPE);
    }
    else {
      pXVar21 = toFill->fBuffer;
      pXVar21[toFill->fIndex] = L'\0';
      XMLScanner::emitError
                (&this->super_XMLScanner,InvalidRootElemInDOCTYPE,pXVar21,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    do {
      XVar12 = ReaderMgr::getNextChar(this_00);
      if (XVar12 == L'\0') break;
    } while (XVar12 != L'>');
    goto LAB_0029fc8e;
  }
  pXVar21 = toFill->fBuffer;
  pXVar21[toFill->fIndex] = L'\0';
  pMVar3 = (this->super_XMLScanner).fMemoryManager;
  (*pMVar3->_vptr_MemoryManager[4])(pMVar3,(this->super_XMLScanner).fRootElemName);
  if (pXVar21 == (XMLCh *)0x0) {
    pXVar17 = (XMLCh *)0x0;
  }
  else {
    pMVar3 = (this->super_XMLScanner).fMemoryManager;
    sVar26 = 0;
    do {
      psVar1 = (short *)((long)pXVar21 + sVar26);
      sVar26 = sVar26 + 2;
    } while (*psVar1 != 0);
    iVar14 = (*pMVar3->_vptr_MemoryManager[3])(pMVar3,sVar26);
    pXVar17 = (XMLCh *)CONCAT44(extraout_var,iVar14);
    memcpy(pXVar17,pXVar21,sVar26);
  }
  (this->super_XMLScanner).fRootElemName = pXVar17;
  ppMVar25 = &(this->super_XMLScanner).fGrammarPoolMemoryManager;
  if ((this->super_XMLScanner).fUseCachedGrammar != false) {
    ppMVar25 = &(this->super_XMLScanner).fMemoryManager;
  }
  pMVar3 = *ppMVar25;
  this_03 = (DTDElementDecl *)XMemory::operator_new(0x58,pMVar3);
  pXVar21 = toFill->fBuffer;
  pXVar21[toFill->fIndex] = L'\0';
  DTDElementDecl::DTDElementDecl
            (this_03,pXVar21,(this->super_XMLScanner).fEmptyNamespaceId,Any,pMVar3);
  (this_03->super_XMLElementDecl).fCreateReason = AsRootElem;
  (this_03->super_XMLElementDecl).fExternalElement = true;
  if ((this->super_XMLScanner).fUseCachedGrammar == false) {
    pGVar5 = (this->super_XMLScanner).fGrammar;
    (*(pGVar5->super_XSerializable)._vptr_XSerializable[0x11])(pGVar5,this_03,0);
    pDVar19 = (DTDElementDecl *)0x0;
  }
  else {
    pNVar4 = this->fDTDElemNonDeclPool;
    pXVar21 = toFill->fBuffer;
    pXVar21[toFill->fIndex] = L'\0';
    if (pNVar4->fIdCounter == 0) {
      pDVar19 = (DTDElementDecl *)0x0;
    }
    else {
      if ((pXVar21 == (XMLCh *)0x0) || (uVar18 = (ulong)(ushort)*pXVar21, uVar18 == 0)) {
        uVar18 = 0;
      }
      else {
        XVar12 = pXVar21[1];
        if (XVar12 != L'\0') {
          pXVar17 = pXVar21 + 2;
          do {
            uVar18 = (ulong)(ushort)XVar12 + (uVar18 >> 0x18) + uVar18 * 0x26;
            XVar12 = *pXVar17;
            pXVar17 = pXVar17 + 1;
          } while (XVar12 != L'\0');
        }
        uVar18 = uVar18 % (pNVar4->fBucketList).fHashModulus;
      }
      pRVar28 = (pNVar4->fBucketList).fBucketList[uVar18];
      if (pRVar28 != (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0) {
        do {
          bVar10 = StringHasher::equals
                             ((StringHasher *)&(pNVar4->fBucketList).field_0x30,pXVar21,
                              pRVar28->fKey);
          if (bVar10) goto LAB_0029f5f9;
          pRVar28 = pRVar28->fNext;
        } while (pRVar28 != (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0);
      }
      pRVar28 = (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0;
LAB_0029f5f9:
      if (pRVar28 == (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0) {
        pDVar19 = (DTDElementDecl *)0x0;
      }
      else {
        pDVar19 = pRVar28->fData;
      }
    }
    if (pDVar19 == (DTDElementDecl *)0x0) {
      XVar22 = NameIdPool<xercesc_4_0::DTDElementDecl>::put(this->fDTDElemNonDeclPool,this_03);
      pDVar19 = (DTDElementDecl *)0x0;
    }
    else {
      XVar22 = (pDVar19->super_XMLElementDecl).fId;
      pDVar19 = this_03;
    }
    (this_03->super_XMLElementDecl).fId = XVar22;
  }
  ReaderMgr::skipPastSpaces(this_00);
  bVar10 = ReaderMgr::skippedChar(this_00,L'>');
  if (bVar10) {
    pDVar2 = (this->super_XMLScanner).fDocTypeHandler;
    if (pDVar2 != (DocTypeHandler *)0x0) {
      (*pDVar2->_vptr_DocTypeHandler[4])(pDVar2,this_03,0,0,0,0);
    }
  }
  else {
    if (((this->super_XMLScanner).fValScheme == Val_Auto) &&
       ((this->super_XMLScanner).fValidate == false)) {
      (this->super_XMLScanner).fValidate = true;
    }
    DTDScanner::DTDScanner
              (&dtdScanner,(DTDGrammar *)(this->super_XMLScanner).fGrammar,
               (this->super_XMLScanner).fDocTypeHandler,
               (this->super_XMLScanner).fGrammarPoolMemoryManager,
               (this->super_XMLScanner).fMemoryManager);
    DTDScanner::setScannerInfo(&dtdScanner,&this->super_XMLScanner,this_00,this_01);
    XVar12 = ReaderMgr::peekNextChar(this_00);
    if (XVar12 == L'[') {
      bVar10 = true;
      pXVar21 = (char16_t *)0x0;
      pcVar20 = (char16_t *)0x0;
LAB_0029f833:
      ArrayJanitor<char16_t>::ArrayJanitor
                (&janSysId,pXVar21,(this->super_XMLScanner).fMemoryManager);
      ArrayJanitor<char16_t>::ArrayJanitor
                (&janPubId,pcVar20,(this->super_XMLScanner).fMemoryManager);
      pDVar2 = (this->super_XMLScanner).fDocTypeHandler;
      if (pDVar2 != (DocTypeHandler *)0x0) {
        (*pDVar2->_vptr_DocTypeHandler[4])
                  (pDVar2,this_03,pcVar20,pXVar21,(ulong)bVar10,(ulong)(XVar12 != L'['));
      }
      if (bVar10 == false) {
LAB_0029f8f0:
        bVar11 = ReaderMgr::skippedChar(this_00,L'>');
        if (!bVar11) {
          bVar11 = ReaderMgr::skippedChar(this_00,L']');
          if ((bVar11) && (bVar11 = ReaderMgr::skippedChar(this_00,L'>'), bVar11)) {
            XMLScanner::emitError(&this->super_XMLScanner,ExtraCloseSquare);
          }
          else {
            XMLScanner::emitError(&this->super_XMLScanner,UnterminatedDOCTYPE);
            do {
              XVar13 = ReaderMgr::getNextChar(this_00);
              if (XVar13 == L'>') break;
            } while (XVar13 != L'\0');
          }
        }
        if (XVar12 != L'[') {
          srcUsed = (InputSource *)0x0;
          pIVar27 = (InputSource *)0x0;
          local_f0 = pcVar20;
          if ((bVar10 == false) && ((this->super_XMLScanner).fUseCachedGrammar != false)) {
            iVar14 = (*(this->super_XMLScanner).super_XMLBufferFullHandler.
                       _vptr_XMLBufferFullHandler[0x11])(this,pXVar21,pcVar20);
            pIVar27 = (InputSource *)CONCAT44(extraout_var_02,iVar14);
            srcUsed = pIVar27;
            if (pIVar27 == (InputSource *)0x0) {
              pIVar27 = (InputSource *)0x0;
              goto LAB_0029fa3f;
            }
            this_02 = (this->super_XMLScanner).fGrammarResolver;
            iVar14 = (*pIVar27->_vptr_InputSource[5])();
            pDVar23 = (DTDGrammar *)
                      GrammarResolver::getGrammar(this_02,(XMLCh *)CONCAT44(extraout_var_03,iVar14))
            ;
            if ((pDVar23 == (DTDGrammar *)0x0) ||
               (iVar14 = (*(pDVar23->super_Grammar).super_XSerializable._vptr_XSerializable[5])
                                   (pDVar23), iVar14 != 0)) goto LAB_0029fa3f;
            this->fDTDGrammar = pDVar23;
            (this->super_XMLScanner).fGrammar = (Grammar *)pDVar23;
            pXVar7 = (this->super_XMLScanner).fValidator;
            (*pXVar7->_vptr_XMLValidator[0xb])(pXVar7,pDVar23);
            pDVar2 = (this->super_XMLScanner).fDocTypeHandler;
            if (pDVar2 != (DocTypeHandler *)0x0) {
              (*pDVar2->_vptr_DocTypeHandler[0x10])();
              (*((this->super_XMLScanner).fDocTypeHandler)->_vptr_DocTypeHandler[10])();
            }
          }
          else {
LAB_0029fa3f:
            if (((this->super_XMLScanner).fLoadExternalDTD != false) ||
               ((this->super_XMLScanner).fValidate == true)) {
              XVar22 = (this->super_XMLScanner).fLowWaterMark;
              bVar10 = (this->super_XMLScanner).fCalculateSrcOfs;
              if (srcUsed == (InputSource *)0x0) {
                pXVar24 = ReaderMgr::createReader
                                    (this_00,pXVar21,local_f0,false,RefFrom_NonLiteral,Type_General,
                                     Source_External,&srcUsed,bVar10,XVar22,
                                     (this->super_XMLScanner).fDisableDefaultEntityResolution);
                pIVar9 = srcUsed;
                if (pIVar27 != (InputSource *)0x0) {
                  (*pIVar27->_vptr_InputSource[1])(pIVar27);
                }
              }
              else {
                pXVar24 = ReaderMgr::createReader
                                    (this_00,srcUsed,false,RefFrom_NonLiteral,Type_General,
                                     Source_External,bVar10,XVar22);
                pIVar9 = pIVar27;
              }
              pIVar27 = pIVar9;
              if (pXVar24 == (XMLReader *)0x0) {
                this_05 = (RuntimeException *)__cxa_allocate_exception(0x30);
                if (srcUsed != (InputSource *)0x0) {
                  iVar14 = (*srcUsed->_vptr_InputSource[5])();
                  pXVar21 = (XMLCh *)CONCAT44(extraout_var_07,iVar14);
                }
                RuntimeException::RuntimeException
                          (this_05,
                           "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
                           ,0x40a,Gen_CouldNotOpenDTD,pXVar21,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0
                           ,(this->super_XMLScanner).fMemoryManager);
                __cxa_throw(this_05,&RuntimeException::typeinfo,XMLException::~XMLException);
              }
              if ((this->super_XMLScanner).fToCacheGrammar == true) {
                pXVar8 = ((this->super_XMLScanner).fGrammarResolver)->fStringPool;
                iVar14 = (*srcUsed->_vptr_InputSource[5])();
                uVar15 = (*(pXVar8->super_XSerializable)._vptr_XSerializable[5])
                                   (pXVar8,CONCAT44(extraout_var_04,iVar14));
                pXVar8 = ((this->super_XMLScanner).fGrammarResolver)->fStringPool;
                iVar14 = (*(pXVar8->super_XSerializable)._vptr_XSerializable[10])
                                   (pXVar8,(ulong)uVar15);
                GrammarResolver::orphanGrammar((this->super_XMLScanner).fGrammarResolver,L"[dtd]");
                iVar16 = (*(((this->super_XMLScanner).fGrammar)->super_XSerializable).
                           _vptr_XSerializable[0x16])();
                (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar16) + 0x50))
                          ((long *)CONCAT44(extraout_var_05,iVar16),iVar14);
                GrammarResolver::putGrammar
                          ((this->super_XMLScanner).fGrammarResolver,
                           (this->super_XMLScanner).fGrammar);
              }
              builtin_memcpy(gDTDStr,L"DTD",8);
              this_04 = (XMLEntityDecl *)
                        XMemory::operator_new(0x60,(this->super_XMLScanner).fMemoryManager);
              XMLEntityDecl::XMLEntityDecl(this_04,gDTDStr,(this->super_XMLScanner).fMemoryManager);
              (this_04->super_XSerializable)._vptr_XSerializable =
                   (_func_int **)&PTR__XMLEntityDecl_00414f98;
              *(undefined2 *)&this_04[1].super_XSerializable._vptr_XSerializable = 0;
              *(undefined1 *)((long)&this_04[1].super_XSerializable._vptr_XSerializable + 2) = 0;
              if (this_04->fSystemId != (XMLCh *)0x0) {
                (*this_04->fMemoryManager->_vptr_MemoryManager[4])();
              }
              if (pXVar21 == (char16_t *)0x0) {
                pXVar17 = (XMLCh *)0x0;
              }
              else {
                sVar26 = 0;
                do {
                  psVar1 = (short *)((long)pXVar21 + sVar26);
                  sVar26 = sVar26 + 2;
                } while (*psVar1 != 0);
                iVar14 = (*this_04->fMemoryManager->_vptr_MemoryManager[3])
                                   (this_04->fMemoryManager,sVar26);
                pXVar17 = (XMLCh *)CONCAT44(extraout_var_06,iVar14);
                memcpy(pXVar17,pXVar21,sVar26);
              }
              this_04->fSystemId = pXVar17;
              this_04->fIsExternal = true;
              pXVar24->fThrowAtEnd = true;
              ReaderMgr::pushReaderAdoptEntity(this_00,pXVar24,this_04,true);
              DTDScanner::scanExtSubsetDecl(&dtdScanner,false,true);
            }
            if (pIVar27 == (InputSource *)0x0) goto LAB_0029fc5e;
          }
          (*pIVar27->_vptr_InputSource[1])(pIVar27);
        }
      }
      else {
        ReaderMgr::getNextChar(this_00);
        XMLScanner::checkInternalDTD(&this->super_XMLScanner,XVar12 != L'[',pXVar21,pcVar20);
        bVar11 = DTDScanner::scanInternalSubset(&dtdScanner);
        if (bVar11) {
          XVar22 = ReaderMgr::getReaderDepth(this_00);
          if (1 < XVar22) {
            XMLScanner::emitError(&this->super_XMLScanner,PEPropogated);
            ReaderMgr::cleanStackBackTo(this_00,1);
          }
          ReaderMgr::skipPastSpaces(this_00);
          goto LAB_0029f8f0;
        }
        do {
          XVar12 = ReaderMgr::getNextChar(this_00);
          if (XVar12 == L'\0') break;
        } while (XVar12 != L'>');
      }
LAB_0029fc5e:
      ArrayJanitor<char16_t>::~ArrayJanitor(&janPubId);
      ArrayJanitor<char16_t>::~ArrayJanitor(&janSysId);
    }
    else {
      (this->super_XMLScanner).fHasNoDTD = false;
      janSysId.fData = (char16_t *)XMLBufferMgr::bidOnBuffer(this_01);
      janSysId.fMemoryManager = (MemoryManager *)this_01;
      janPubId.fData = (char16_t *)XMLBufferMgr::bidOnBuffer(this_01);
      janPubId.fMemoryManager = (MemoryManager *)this_01;
      bVar11 = DTDScanner::scanId(&dtdScanner,(XMLBuffer *)janSysId.fData,
                                  (XMLBuffer *)janPubId.fData,IDType_External);
      if (bVar11) {
        pvVar6 = *(void **)(janSysId.fData + 0x18);
        *(undefined2 *)((long)pvVar6 + *(long *)janSysId.fData * 2) = 0;
        if (pvVar6 == (void *)0x0) {
          pcVar20 = (char16_t *)0x0;
        }
        else {
          pMVar3 = (this->super_XMLScanner).fMemoryManager;
          sVar26 = 0;
          do {
            psVar1 = (short *)((long)pvVar6 + sVar26);
            sVar26 = sVar26 + 2;
          } while (*psVar1 != 0);
          iVar14 = (*pMVar3->_vptr_MemoryManager[3])(pMVar3,sVar26);
          pcVar20 = (char16_t *)CONCAT44(extraout_var_00,iVar14);
          memcpy(pcVar20,pvVar6,sVar26);
        }
        pvVar6 = *(void **)(janPubId.fData + 0x18);
        *(undefined2 *)((long)pvVar6 + *(long *)janPubId.fData * 2) = 0;
        local_f0 = pcVar20;
        if (pvVar6 == (void *)0x0) {
          pXVar21 = (char16_t *)0x0;
        }
        else {
          pMVar3 = (this->super_XMLScanner).fMemoryManager;
          sVar26 = 0;
          do {
            psVar1 = (short *)((long)pvVar6 + sVar26);
            sVar26 = sVar26 + 2;
          } while (*psVar1 != 0);
          iVar14 = (*pMVar3->_vptr_MemoryManager[3])(pMVar3,sVar26);
          pXVar21 = (XMLCh *)CONCAT44(extraout_var_01,iVar14);
          memcpy(pXVar21,pvVar6,sVar26);
        }
        ReaderMgr::skipPastSpaces(this_00);
        XVar13 = ReaderMgr::peekNextChar(this_00);
        bVar10 = XVar13 == L'[';
        pcVar20 = local_f0;
      }
      else {
        do {
          XVar13 = ReaderMgr::getNextChar(this_00);
          if (XVar13 == L'\0') break;
        } while (XVar13 != L'>');
        pXVar21 = (char16_t *)0x0;
        pcVar20 = (char16_t *)0x0;
        bVar10 = false;
      }
      XMLBufferMgr::releaseBuffer
                ((XMLBufferMgr *)janPubId.fMemoryManager,(XMLBuffer *)janPubId.fData);
      XMLBufferMgr::releaseBuffer
                ((XMLBufferMgr *)janSysId.fMemoryManager,(XMLBuffer *)janSysId.fData);
      if (bVar11) goto LAB_0029f833;
    }
    DTDScanner::~DTDScanner(&dtdScanner);
  }
  if (pDVar19 != (DTDElementDecl *)0x0) {
    (*(pDVar19->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[1])(pDVar19);
  }
LAB_0029fc8e:
  XMLBufferMgr::releaseBuffer(this_01,toFill);
  return;
}

Assistant:

void DGXMLScanner::scanDocTypeDecl()
{
    if (fDocTypeHandler)
        fDocTypeHandler->resetDocType();

    // There must be some space after DOCTYPE
    bool skippedSomething;
    fReaderMgr.skipPastSpaces(skippedSomething);
    if (!skippedSomething)
    {
        emitError(XMLErrs::ExpectedWhitespace);

        // Just skip the Doctype declaration and return
        fReaderMgr.skipPastChar(chCloseAngle);
        return;
    }

    // Get a buffer for the root element
    XMLBufBid bbRootName(&fBufMgr);

    //  Get a name from the input, which should be the name of the root
    //  element of the upcoming content.
    int  colonPosition;
    bool validName = fDoNamespaces ? fReaderMgr.getQName(bbRootName.getBuffer(), &colonPosition) :
                                     fReaderMgr.getName(bbRootName.getBuffer());
    if (!validName)
    {
        if (bbRootName.isEmpty())
            emitError(XMLErrs::NoRootElemInDOCTYPE);
        else
            emitError(XMLErrs::InvalidRootElemInDOCTYPE, bbRootName.getRawBuffer());
        fReaderMgr.skipPastChar(chCloseAngle);
        return;
    }

    //  Store the root element name for later check
    setRootElemName(bbRootName.getRawBuffer());

    //  This element obviously is not going to exist in the element decl
    //  pool yet, but we need to call docTypeDecl. So force it into
    //  the element decl pool, marked as being there because it was in
    //  the DOCTYPE. Later, when its declared, the status will be updated.
    //
    //  Only do this if we are not reusing the validator! If we are reusing,
    //  then look it up instead. It has to exist!
    MemoryManager* const  rootDeclMgr =
        fUseCachedGrammar ? fMemoryManager : fGrammarPoolMemoryManager;

    DTDElementDecl* rootDecl = new (rootDeclMgr) DTDElementDecl
    (
        bbRootName.getRawBuffer()
        , fEmptyNamespaceId
        , DTDElementDecl::Any
        , rootDeclMgr
    );

    Janitor<DTDElementDecl> rootDeclJanitor(rootDecl);
    rootDecl->setCreateReason(DTDElementDecl::AsRootElem);
    rootDecl->setExternalElemDeclaration(true);
    if(!fUseCachedGrammar)
    {
        fGrammar->putElemDecl(rootDecl);
        rootDeclJanitor.release();
    } else
    {
        // put this in the undeclared pool so it gets deleted...
        XMLElementDecl* elemDecl = fDTDElemNonDeclPool->getByKey(bbRootName.getRawBuffer());
        if (elemDecl)
        {
            rootDecl->setId(elemDecl->getId());
        }
        else
        {
            rootDecl->setId(fDTDElemNonDeclPool->put((DTDElementDecl*)rootDecl));
            rootDeclJanitor.release();
        }
    }

    // Skip any spaces after the name
    fReaderMgr.skipPastSpaces();

    //  And now if we are looking at a >, then we are done. It is not
    //  required to have an internal or external subset, though why you
    //  would not escapes me.
    if (fReaderMgr.skippedChar(chCloseAngle)) {

        //  If we have a doc type handler and advanced callbacks are enabled,
        //  call the doctype event.
        if (fDocTypeHandler)
            fDocTypeHandler->doctypeDecl(*rootDecl, 0, 0, false);
        return;
    }

    // either internal/external subset
    if (fValScheme == Val_Auto && !fValidate)
        fValidate = true;

    bool    hasIntSubset = false;
    bool    hasExtSubset = false;
    XMLCh*  sysId = 0;
    XMLCh*  pubId = 0;

    DTDScanner dtdScanner
    (
        (DTDGrammar*) fGrammar
        , fDocTypeHandler
        , fGrammarPoolMemoryManager
        , fMemoryManager
    );
    dtdScanner.setScannerInfo(this, &fReaderMgr, &fBufMgr);

    //  If the next character is '[' then we have no external subset cause
    //  there is no system id, just the opening character of the internal
    //  subset. Else, has to be an id.
    //
    // Just look at the next char, don't eat it.
    if (fReaderMgr.peekNextChar() == chOpenSquare)
    {
        hasIntSubset = true;
    }
    else
    {
        // Indicate we have an external subset
        hasExtSubset = true;
        fHasNoDTD = false;

        // Get buffers for the ids
        XMLBufBid bbPubId(&fBufMgr);
        XMLBufBid bbSysId(&fBufMgr);

        // Get the external subset id
        if (!dtdScanner.scanId(bbPubId.getBuffer(), bbSysId.getBuffer(), DTDScanner::IDType_External))
        {
            fReaderMgr.skipPastChar(chCloseAngle);
            return;
        }

        // Get copies of the ids we got
        pubId = XMLString::replicate(bbPubId.getRawBuffer(), fMemoryManager);
        sysId = XMLString::replicate(bbSysId.getRawBuffer(), fMemoryManager);

        // Skip spaces and check again for the opening of an internal subset
        fReaderMgr.skipPastSpaces();

        // Just look at the next char, don't eat it.
        if (fReaderMgr.peekNextChar() == chOpenSquare) {
            hasIntSubset = true;
        }
    }

    // Insure that the ids get cleaned up, if they got allocated
    ArrayJanitor<XMLCh> janSysId(sysId, fMemoryManager);
    ArrayJanitor<XMLCh> janPubId(pubId, fMemoryManager);

    //  If we have a doc type handler and advanced callbacks are enabled,
    //  call the doctype event.
    if (fDocTypeHandler)
        fDocTypeHandler->doctypeDecl(*rootDecl, pubId, sysId, hasIntSubset, hasExtSubset);

    //  Ok, if we had an internal subset, we are just past the [ character
    //  and need to parse that first.
    if (hasIntSubset)
    {
        // Eat the opening square bracket
        fReaderMgr.getNextChar();

        checkInternalDTD(hasExtSubset, sysId, pubId);

        //  And try to scan the internal subset. If we fail, try to recover
        //  by skipping forward tot he close angle and returning.
        if (!dtdScanner.scanInternalSubset())
        {
            fReaderMgr.skipPastChar(chCloseAngle);
            return;
        }

        //  Do a sanity check that some expanded PE did not propogate out of
        //  the doctype. This could happen if it was terminated early by bad
        //  syntax.
        if (fReaderMgr.getReaderDepth() > 1)
        {
            emitError(XMLErrs::PEPropogated);

            // Ask the reader manager to pop back down to the main level
            fReaderMgr.cleanStackBackTo(1);
        }

        fReaderMgr.skipPastSpaces();
    }

    // And that should leave us at the closing > of the DOCTYPE line
    if (!fReaderMgr.skippedChar(chCloseAngle))
    {
        //  Do a special check for the common scenario of an extra ] char at
        //  the end. This is easy to recover from.
        if (fReaderMgr.skippedChar(chCloseSquare)
        &&  fReaderMgr.skippedChar(chCloseAngle))
        {
            emitError(XMLErrs::ExtraCloseSquare);
        }
         else
        {
            emitError(XMLErrs::UnterminatedDOCTYPE);
            fReaderMgr.skipPastChar(chCloseAngle);
        }
    }

    //  If we had an external subset, then we need to deal with that one
    //  next. If we are reusing the validator, then don't scan it.
    if (hasExtSubset) {

        InputSource* srcUsed=0;
        Janitor<InputSource> janSrc(srcUsed);
        // If we had an internal subset and we're using the cached grammar, it
        // means that the ignoreCachedDTD is set, so we ignore the cached
        // grammar
        if (fUseCachedGrammar && !hasIntSubset)
        {
            srcUsed = resolveSystemId(sysId, pubId);
            if (srcUsed) {
                janSrc.reset(srcUsed);
                Grammar* grammar = fGrammarResolver->getGrammar(srcUsed->getSystemId());

                if (grammar && grammar->getGrammarType() == Grammar::DTDGrammarType) {

                    fDTDGrammar = (DTDGrammar*) grammar;
                    fGrammar = fDTDGrammar;
                    fValidator->setGrammar(fGrammar);
                    // If we don't report at least the external subset boundaries,
                    // an advanced document handler cannot know when the DTD end,
                    // since we've already sent a doctype decl that indicates there's
                    // there's an external subset.
                    if (fDocTypeHandler)
                    {
                        fDocTypeHandler->startExtSubset();
                        fDocTypeHandler->endExtSubset();
                    }

                    return;
                }
            }
        }

        if (fLoadExternalDTD || fValidate)
        {
            // And now create a reader to read this entity
            XMLReader* reader;
            if(srcUsed) {
                reader = fReaderMgr.createReader
                        (
                            *srcUsed
                            , false
                            , XMLReader::RefFrom_NonLiteral
                            , XMLReader::Type_General
                            , XMLReader::Source_External
                            , fCalculateSrcOfs
                            , fLowWaterMark
                        );
            }
            else {
                reader = fReaderMgr.createReader
                        (
                            sysId
                            , pubId
                            , false
                            , XMLReader::RefFrom_NonLiteral
                            , XMLReader::Type_General
                            , XMLReader::Source_External
                            , srcUsed
                            , fCalculateSrcOfs
                            , fLowWaterMark
                            , fDisableDefaultEntityResolution
                        );
                janSrc.reset(srcUsed);
            }
            //  If it failed then throw an exception
            if (!reader)
                ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::Gen_CouldNotOpenDTD, srcUsed ? srcUsed->getSystemId() : sysId, fMemoryManager);

            if (fToCacheGrammar) {

                unsigned int stringId = fGrammarResolver->getStringPool()->addOrFind(srcUsed->getSystemId());
                const XMLCh* sysIdStr = fGrammarResolver->getStringPool()->getValueForId(stringId);

                fGrammarResolver->orphanGrammar(XMLUni::fgDTDEntityString);
                ((XMLDTDDescription*) (fGrammar->getGrammarDescription()))->setSystemId(sysIdStr);
                fGrammarResolver->putGrammar(fGrammar);
            }

            //  In order to make the processing work consistently, we have to
            //  make this look like an external entity. So create an entity
            //  decl and fill it in and push it with the reader, as happens
            //  with an external entity. Put a janitor on it to insure it gets
            //  cleaned up. The reader manager does not adopt them.
            const XMLCh gDTDStr[] = { chLatin_D, chLatin_T, chLatin_D , chNull };
            DTDEntityDecl* declDTD = new (fMemoryManager) DTDEntityDecl(gDTDStr, false, fMemoryManager);
            declDTD->setSystemId(sysId);
            declDTD->setIsExternal(true);

            // Mark this one as a throw at end
            reader->setThrowAtEnd(true);

            // And push it onto the stack, with its pseudo name
            fReaderMgr.pushReaderAdoptEntity(reader, declDTD);

            // Tell it its not in an include section
            dtdScanner.scanExtSubsetDecl(false, true);
        }
    }
}